

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::
       parse_arg_id<char,fmt::v6::internal::width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>_>
  *psVar2;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *this;
  dynamic_format_specs<char> *pdVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *local_20;
  
  bVar1 = *begin;
  local_20 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
    ::on_dynamic_width<fmt::v6::internal::auto_id>
              (&handler->handler->
                super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
              );
    local_20 = (byte *)begin;
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    iVar4 = parse_nonnegative_int<char,fmt::v6::internal::width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>>>&,char>&>
                      ((char **)&local_20,end,handler);
    if ((local_20 == (byte *)end) || ((*local_20 != 0x3a && (*local_20 != 0x7d)))) {
LAB_00137c5f:
      error_handler::on_error
                ((error_handler *)
                 (handler->handler->
                 super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
                 ).context_,"invalid format string");
    }
    psVar2 = handler->handler;
    this = (psVar2->
           super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
           ).context_;
    if (0 < this->next_arg_id_) {
      error_handler::on_error
                ((error_handler *)this,"cannot switch from automatic to manual argument indexing");
    }
    this->next_arg_id_ = -1;
    pdVar3 = (psVar2->
             super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
             ).specs_;
    (pdVar3->width_ref).kind = index;
    (pdVar3->width_ref).val.index = iVar4;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_00137c5f;
    pbVar6 = (byte *)(begin + 1);
    do {
      pbVar5 = pbVar6;
      local_20 = (byte *)end;
      if (pbVar5 == (byte *)end) break;
      bVar1 = *pbVar5;
      pbVar6 = pbVar5 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (local_20 = pbVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    pdVar3 = (handler->handler->
             super_dynamic_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>_>
             ).specs_;
    (pdVar3->width_ref).kind = name;
    (pdVar3->width_ref).val.name.data_ = begin;
    (pdVar3->width_ref).val.name.size_ = (long)local_20 - (long)begin;
  }
  return (char *)local_20;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}